

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_unicode_sets.cpp
# Opt level: O0

UnicodeSet * icu_63::unisets::get(Key key)

{
  UBool UVar1;
  UErrorCode local_18;
  Key local_14;
  UErrorCode localStatus;
  Key key_local;
  
  local_18 = U_ZERO_ERROR;
  local_14 = key;
  umtx_initOnce((UInitOnce *)&::(anonymous_namespace)::gNumberParseUniSetsInitOnce,
                anon_unknown.dwarf_226744::initNumberParseUniSets,&local_18);
  UVar1 = ::U_FAILURE(local_18);
  if (UVar1 == '\0') {
    _localStatus = (undefined1 *)anon_unknown.dwarf_226744::getImpl(local_14);
  }
  else {
    _localStatus = ::(anonymous_namespace)::gEmptyUnicodeSet;
  }
  return (UnicodeSet *)_localStatus;
}

Assistant:

const UnicodeSet* unisets::get(Key key) {
    UErrorCode localStatus = U_ZERO_ERROR;
    umtx_initOnce(gNumberParseUniSetsInitOnce, &initNumberParseUniSets, localStatus);
    if (U_FAILURE(localStatus)) {
        return reinterpret_cast<UnicodeSet*>(gEmptyUnicodeSet);
    }
    return getImpl(key);
}